

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  pointer pUVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  UnknownField *this;
  long lVar7;
  int i;
  long lVar8;
  
  lVar7 = 0;
  sVar6 = 0;
  for (lVar8 = 0;
      pUVar1 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(unknown_fields->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4);
      lVar8 = lVar8 + 1) {
    if (*(int *)((long)&pUVar1->type_ + lVar7) == 3) {
      this = (UnknownField *)((long)&pUVar1->number_ + lVar7);
      uVar4 = this->number_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = UnknownField::GetLengthDelimitedSize(this);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = (long)(int)(uint)sVar5 + sVar6 + 4 + (ulong)(iVar3 * 9 + 0x49U >> 6) +
              (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
    lVar7 = lVar7 + 0x10;
  }
  return sVar6;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}